

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrieinp.c
# Opt level: O0

void * tommy_trie_inplace_remove(tommy_trie_inplace *trie_inplace,tommy_key_t key)

{
  long lVar1;
  tommy_trie_inplace_node *ptVar2;
  long in_FS_OFFSET;
  tommy_trie_inplace_node **let_ptr;
  tommy_trie_inplace_node *ret;
  tommy_key_t key_local;
  tommy_trie_inplace *trie_inplace_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar2 = trie_inplace_bucket_remove
                     (0x1a,trie_inplace->bucket + (key >> 0x1a),(tommy_trie_inplace_node *)0x0,key);
  if (ptVar2 == (tommy_trie_inplace_node *)0x0) {
    trie_inplace_local = (tommy_trie_inplace *)0x0;
  }
  else {
    trie_inplace->count = trie_inplace->count - 1;
    trie_inplace_local = (tommy_trie_inplace *)ptVar2->data;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return trie_inplace_local;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_trie_inplace_remove(tommy_trie_inplace* trie_inplace, tommy_key_t key)
{
	tommy_trie_inplace_node* ret;
	tommy_trie_inplace_node** let_ptr;

	let_ptr = &trie_inplace->bucket[key >> TOMMY_TRIE_INPLACE_BUCKET_SHIFT];

	ret = trie_inplace_bucket_remove(TOMMY_TRIE_INPLACE_BUCKET_SHIFT, let_ptr, 0, key);

	if (!ret)
		return 0;

	--trie_inplace->count;

	return ret->data;
}